

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LValue.cpp
# Opt level: O2

ConstantValue * __thiscall
slang::ast::LValue::load(ConstantValue *__return_storage_ptr__,LValue *this)

{
  __index_type _Var1;
  LValue *pLVar2;
  __index_type _Var3;
  variant_alternative_t<1UL,_variant<monostate,_Path,_Concat>_> *pvVar4;
  long lVar5;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  *ctx;
  pointer pvVar6;
  LValue *pLVar7;
  span<const_slang::SVInt,_18446744073709551615UL> operands;
  vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> vals;
  ConstantValue result;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_a8;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_78;
  char local_58;
  
  _Var1 = *(__index_type *)
           ((long)&(this->value).
                   super__Variant_base<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                   .
                   super__Move_assign_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                   .
                   super__Copy_assign_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                   .
                   super__Move_ctor_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                   .
                   super__Copy_ctor_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                   .
                   super__Variant_storage_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
           + 0x180);
  if (_Var1 == '\x02') {
    if (*(int *)((long)&(this->value).
                        super__Variant_base<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                        .
                        super__Move_assign_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                        .
                        super__Copy_assign_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                        .
                        super__Move_ctor_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                        .
                        super__Copy_ctor_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                        .
                        super__Variant_storage_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                + 0x18) == 0) {
      local_78._0_8_ = (long)&local_78 + 0x18;
      local_78._8_8_ = 0;
      local_78._16_8_ = 2;
      SmallVectorBase<slang::SVInt>::reserve
                ((SmallVectorBase<slang::SVInt> *)&local_78,
                 (*(long *)((long)&(this->value).
                                   super__Variant_base<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                                   .
                                   super__Move_assign_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                                   .
                                   super__Copy_assign_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                                   .
                                   super__Move_ctor_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                                   .
                                   super__Copy_ctor_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                                   .
                                   super__Variant_storage_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                           + 8) -
                 *(long *)&(this->value).
                           super__Variant_base<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                           .
                           super__Move_assign_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                           .
                           super__Copy_assign_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                           .
                           super__Move_ctor_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                           .
                           super__Copy_ctor_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                           .
                           super__Variant_storage_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                 ) / 0x188);
      pLVar2 = *(LValue **)
                ((long)&(this->value).
                        super__Variant_base<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                        .
                        super__Move_assign_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                        .
                        super__Copy_assign_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                        .
                        super__Move_ctor_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                        .
                        super__Copy_ctor_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                        .
                        super__Variant_storage_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                + 8);
      for (pLVar7 = *(LValue **)
                     &(this->value).
                      super__Variant_base<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                      .
                      super__Move_assign_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                      .
                      super__Copy_assign_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                      .
                      super__Move_ctor_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                      .
                      super__Copy_ctor_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                      .
                      super__Variant_storage_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
          ; pLVar7 != pLVar2; pLVar7 = pLVar7 + 1) {
        load((ConstantValue *)&local_a8,pLVar7);
        ConstantValue::integer((ConstantValue *)&stack0xffffffffffffffc0);
        SmallVectorBase<slang::SVInt>::emplace_back<slang::SVInt>
                  ((SmallVectorBase<slang::SVInt> *)&local_78,(SVInt *)&stack0xffffffffffffffc0);
        SVInt::~SVInt((SVInt *)&stack0xffffffffffffffc0);
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             *)&local_a8);
      }
      operands._M_extent._M_extent_value = local_78._0_8_;
      operands._M_ptr = (pointer)&local_a8;
      SVInt::concat(operands);
      ctx = &local_a8;
      std::
      variant<std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
      ::variant<slang::SVInt,void,void,slang::SVInt,void>
                ((variant<std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                  *)__return_storage_ptr__,(SVInt *)&local_a8);
      SVInt::~SVInt((SVInt *)&local_a8);
      SmallVectorBase<slang::SVInt>::cleanup
                ((SmallVectorBase<slang::SVInt> *)&local_78,(EVP_PKEY_CTX *)ctx);
    }
    else {
      local_a8._0_8_ = 0;
      local_a8._8_8_ = 0;
      local_a8._16_8_ = 0;
      std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::reserve
                ((vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)&local_a8,
                 (*(long *)((long)&(this->value).
                                   super__Variant_base<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                                   .
                                   super__Move_assign_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                                   .
                                   super__Copy_assign_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                                   .
                                   super__Move_ctor_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                                   .
                                   super__Copy_ctor_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                                   .
                                   super__Variant_storage_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                           + 8) -
                 *(long *)&(this->value).
                           super__Variant_base<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                           .
                           super__Move_assign_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                           .
                           super__Copy_assign_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                           .
                           super__Move_ctor_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                           .
                           super__Copy_ctor_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                           .
                           super__Variant_storage_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                 ) / 0x188);
      pLVar2 = *(LValue **)
                ((long)&(this->value).
                        super__Variant_base<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                        .
                        super__Move_assign_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                        .
                        super__Copy_assign_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                        .
                        super__Move_ctor_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                        .
                        super__Copy_ctor_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                        .
                        super__Variant_storage_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                + 8);
      for (pLVar7 = *(LValue **)
                     &(this->value).
                      super__Variant_base<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                      .
                      super__Move_assign_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                      .
                      super__Copy_assign_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                      .
                      super__Move_ctor_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                      .
                      super__Copy_ctor_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                      .
                      super__Variant_storage_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
          ; pLVar7 != pLVar2; pLVar7 = pLVar7 + 1) {
        load((ConstantValue *)&local_78,pLVar7);
        std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::
        emplace_back<slang::ConstantValue>
                  ((vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)&local_a8,
                   (ConstantValue *)&local_78);
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             *)&local_78);
      }
      *(undefined8 *)
       &(__return_storage_ptr__->value).
        super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        .
        super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        .
        super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        .
        super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        .
        super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        .
        super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           = local_a8._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->value).
               super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
       + 8) = local_a8._8_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->value).
               super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
       + 0x10) = local_a8._16_8_;
      local_a8._0_8_ = 0;
      local_a8._8_8_ = 0;
      local_a8._16_8_ = 0;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->value).
               super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
       + 0x20) = '\x05';
      std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::~vector
                ((vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)&local_a8);
    }
  }
  else if (_Var1 == '\0') {
    *(__index_type *)
     ((long)&(__return_storage_ptr__->value).
             super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
     + 0x20) = '\0';
  }
  else {
    pvVar4 = std::get<1ul,std::monostate,slang::ast::LValue::Path,slang::ast::LValue::Concat>
                       (&this->value);
    std::__detail::__variant::
    _Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       *)&local_78,
                      (_Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       *)pvVar4->base);
    pvVar6 = (pvVar4->elements).
             super_SmallVectorBase<std::variant<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>_>
             .data_;
    for (lVar5 = (pvVar4->elements).
                 super_SmallVectorBase<std::variant<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>_>
                 .len * 0x58; lVar5 != 0; lVar5 = lVar5 + -0x58) {
      if (local_58 == '\0') {
        *(__index_type *)
         ((long)&(__return_storage_ptr__->value).
                 super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                 .
                 super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                 .
                 super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                 .
                 super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                 .
                 super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                 .
                 super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
         + 0x20) = '\0';
        goto LAB_002ebc2b;
      }
      _Var3 = *(__index_type *)
               ((long)&(pvVar6->
                       super__Variant_base<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
                       ).
                       super__Move_assign_alias<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
                       .
                       super__Copy_assign_alias<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
                       .
                       super__Move_ctor_alias<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
                       .
                       super__Copy_ctor_alias<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
               + 0x50);
      local_a8._0_8_ = &local_78;
      if (_Var3 == 0xff) {
        std::__throw_bad_variant_access("std::visit: variant is valueless");
        _Var3 = *(__index_type *)
                 ((long)&(pvVar6->
                         super__Variant_base<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
                         ).
                         super__Move_assign_alias<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
                         .
                         super__Copy_assign_alias<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
                         .
                         super__Move_ctor_alias<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
                         .
                         super__Copy_ctor_alias<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
                 + 0x50);
      }
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__deduce_visit_result<void>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/ast/LValue.cpp:61:13)_&&,_const_std::variant<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>_&>
        ::_S_vtable._M_arr[(char)_Var3]._M_data)((anon_class_8_1_6971b95b *)&local_a8,pvVar6);
      pvVar6 = pvVar6 + 1;
    }
    std::__detail::__variant::
    _Move_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
    ::_Move_ctor_base((_Move_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       *)__return_storage_ptr__,
                      (_Move_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       *)&local_78);
LAB_002ebc2b:
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
    ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                         *)&local_78);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstantValue LValue::load() const {
    if (bad())
        return nullptr;

    auto concat = std::get_if<Concat>(&value);
    if (concat) {
        if (concat->kind == Concat::Packed) {
            SmallVector<SVInt> vals;
            vals.reserve(concat->elems.size());
            for (auto& elem : concat->elems)
                vals.push_back(elem.load().integer());
            return SVInt::concat(vals);
        }
        else {
            std::vector<ConstantValue> vals;
            vals.reserve(concat->elems.size());
            for (auto& elem : concat->elems)
                vals.push_back(elem.load());
            return vals;
        }
    }

    // Otherwise, we have an lvalue path. Walk the path and apply each element.
    auto& path = std::get<Path>(value);
    ConstantValue result = *path.base;
    for (auto& elem : path.elements) {
        if (!result)
            return nullptr;

        std::visit(
            [&result](auto&& arg) {
                using T = std::decay_t<decltype(arg)>;
                if constexpr (std::is_same_v<T, BitSlice>) {
                    result = result.getSlice(arg.range.upper(), arg.range.lower(), nullptr);
                }
                else if constexpr (std::is_same_v<T, ElementIndex>) {
                    if (arg.forceOutOfBounds) {
                        result = arg.defaultValue;
                    }
                    else if (result.isUnion()) {
                        // If we're selecting the active member all is well. If not,
                        // we need to return the default value because we have no
                        // idea what type this should be.
                        if (arg.index < 0 || result.unionVal()->activeMember != uint32_t(arg.index))
                            result = arg.defaultValue;
                    }
                    else if (arg.index < 0 || size_t(arg.index) >= result.size()) {
                        result = arg.defaultValue;
                    }
                    else if (result.isString()) {
                        result = SVInt(8, (uint64_t)result.str()[size_t(arg.index)], false);
                    }
                    else {
                        // Be careful not to assign to the result while
                        // still referencing its elements.
                        ConstantValue temp(std::move(result.at(size_t(arg.index))));
                        result = std::move(temp);
                    }
                }
                else if constexpr (std::is_same_v<T, ArraySlice>) {
                    result = result.getSlice(arg.range.upper(), arg.range.lower(),
                                             arg.defaultValue);
                }
                else if constexpr (std::is_same_v<T, ArrayLookup>) {
                    auto& map = *result.map();
                    if (auto it = map.find(arg.index); it != map.end()) {
                        // If we find the index in the target map, return the value.
                        ConstantValue temp(std::move(it->second));
                        result = std::move(temp);
                    }
                    else if (map.defaultValue) {
                        // Otherwise, if the map itself has a default set, use that.
                        ConstantValue temp(std::move(map.defaultValue));
                        result = std::move(temp);
                    }
                    else {
                        // Finally, fall back on whatever the default default is.
                        result = arg.defaultValue;
                    }
                }
                else {
                    static_assert(always_false<T>::value, "Missing case");
                }
            },
            elem);
    }

    return result;
}